

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

char ** build_envp(JSContext *ctx,JSValue obj)

{
  JSValue val1;
  JSValue v;
  int iVar1;
  char *__s;
  char *__s_00;
  JSContext *ctx_00;
  char *__dest;
  JSValue JVar2;
  size_t str_len;
  size_t key_len;
  JSValue val;
  char *str;
  char *key;
  char *pair;
  char **envp;
  JSPropertyEnum *tab;
  uint32_t i;
  uint32_t len;
  JSAtom in_stack_0000009c;
  JSContext *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  BOOL in_stack_00000140;
  undefined4 in_stack_ffffffffffffff48;
  JSAtom in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  JSAtom in_stack_ffffffffffffff54;
  uint32_t *in_stack_ffffffffffffff58;
  JSContext *in_stack_ffffffffffffff60;
  JSContext *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  JSAtom atom;
  int64_t in_stack_ffffffffffffff78;
  JSValueUnion ctx_01;
  char **local_68;
  uint local_58;
  uint local_54;
  char **local_38;
  JSValueUnion local_8;
  
  JVar2.u._4_4_ = in_stack_ffffffffffffff74;
  JVar2.u.int32 = in_stack_ffffffffffffff70;
  JVar2.tag = in_stack_ffffffffffffff78;
  iVar1 = JS_GetOwnPropertyNames
                    (in_stack_ffffffffffffff68,(JSPropertyEnum **)in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff58,JVar2,in_stack_ffffffffffffff54);
  if (iVar1 < 0) {
    local_38 = (char **)0x0;
  }
  else {
    local_68 = (char **)js_mallocz(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
    if (local_68 == (char **)0x0) {
LAB_00118f49:
      if (local_68 != (char **)0x0) {
        for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
          js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        }
        js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_68 = (char **)0x0;
      }
    }
    else {
      for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
        in_stack_ffffffffffffff48 = 0;
        JVar2 = JS_GetPropertyInternal
                          (in_stack_000000a0,(JSValue)in_stack_000000b8,in_stack_0000009c,
                           (JSValue)in_stack_000000a8,in_stack_00000140);
        local_8 = (JSValueUnion)JVar2.tag;
        in_stack_ffffffffffffff50 = JVar2.u._0_4_;
        in_stack_ffffffffffffff54 = JVar2.u._4_4_;
        atom = in_stack_ffffffffffffff54;
        ctx_01 = local_8;
        iVar1 = JS_IsException(JVar2);
        if (iVar1 != 0) goto LAB_00118f49;
        val1.u._4_4_ = in_stack_ffffffffffffff4c;
        val1.u.int32 = in_stack_ffffffffffffff48;
        val1.tag._0_4_ = in_stack_ffffffffffffff50;
        val1.tag._4_4_ = in_stack_ffffffffffffff54;
        __s = JS_ToCString((JSContext *)0x118d99,val1);
        v.tag = (int64_t)in_stack_ffffffffffffff60;
        v.u.ptr = local_8.ptr;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),v);
        if (__s == (char *)0x0) goto LAB_00118f49;
        __s_00 = JS_AtomToCString((JSContext *)ctx_01.ptr,atom);
        if (__s_00 == (char *)0x0) {
          JS_FreeCString(in_stack_ffffffffffffff60,(char *)local_8.ptr);
          goto LAB_00118f49;
        }
        ctx_00 = (JSContext *)strlen(__s_00);
        in_stack_ffffffffffffff60 = (JSContext *)strlen(__s);
        __dest = (char *)js_malloc(ctx_00,(size_t)in_stack_ffffffffffffff60);
        if (__dest == (char *)0x0) {
          JS_FreeCString(in_stack_ffffffffffffff60,(char *)local_8.ptr);
          JS_FreeCString(in_stack_ffffffffffffff60,(char *)local_8.ptr);
          goto LAB_00118f49;
        }
        memcpy(__dest,__s_00,(size_t)ctx_00);
        __dest[(long)ctx_00] = '=';
        memcpy(__dest + (long)ctx_00 + 1,__s,(size_t)in_stack_ffffffffffffff60);
        __dest[(long)((undefined1 *)((long)&(ctx_00->header).ref_count + 1) +
                     (long)in_stack_ffffffffffffff60)] = '\0';
        local_68[local_58] = __dest;
        JS_FreeCString(in_stack_ffffffffffffff60,(char *)local_8.ptr);
        JS_FreeCString(in_stack_ffffffffffffff60,(char *)local_8.ptr);
      }
    }
    for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
      JS_FreeAtom((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                  in_stack_ffffffffffffff4c);
    }
    js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
            (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_38 = local_68;
  }
  return local_38;
}

Assistant:

static char **build_envp(JSContext *ctx, JSValueConst obj)
{
    uint32_t len, i;
    JSPropertyEnum *tab;
    char **envp, *pair;
    const char *key, *str;
    JSValue val;
    size_t key_len, str_len;
    
    if (JS_GetOwnPropertyNames(ctx, &tab, &len, obj,
                               JS_GPN_STRING_MASK | JS_GPN_ENUM_ONLY) < 0)
        return NULL;
    envp = js_mallocz(ctx, sizeof(envp[0]) * ((size_t)len + 1));
    if (!envp)
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_GetProperty(ctx, obj, tab[i].atom);
        if (JS_IsException(val))
            goto fail;
        str = JS_ToCString(ctx, val);
        JS_FreeValue(ctx, val);
        if (!str)
            goto fail;
        key = JS_AtomToCString(ctx, tab[i].atom);
        if (!key) {
            JS_FreeCString(ctx, str);
            goto fail;
        }
        key_len = strlen(key);
        str_len = strlen(str);
        pair = js_malloc(ctx, key_len + str_len + 2);
        if (!pair) {
            JS_FreeCString(ctx, key);
            JS_FreeCString(ctx, str);
            goto fail;
        }
        memcpy(pair, key, key_len);
        pair[key_len] = '=';
        memcpy(pair + key_len + 1, str, str_len);
        pair[key_len + 1 + str_len] = '\0';
        envp[i] = pair;
        JS_FreeCString(ctx, key);
        JS_FreeCString(ctx, str);
    }
 done:
    for(i = 0; i < len; i++)
        JS_FreeAtom(ctx, tab[i].atom);
    js_free(ctx, tab);
    return envp;
 fail:
    if (envp) {
        for(i = 0; i < len; i++)
            js_free(ctx, envp[i]);
        js_free(ctx, envp);
        envp = NULL;
    }
    goto done;
}